

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addTextureOperations(GLES2ThreadedSharingTest *this)

{
  EGLThread *pEVar1;
  pointer ppEVar2;
  int iVar3;
  CreateShader *pCVar4;
  ShaderSource *pSVar5;
  ShaderCompile *pSVar6;
  CreateProgram *this_00;
  AttachShader *pAVar7;
  LinkProgram *this_01;
  CreateTexture *this_02;
  TexImage2D *pTVar8;
  CopyTexImage2D *pCVar9;
  TexSubImage2D *pTVar10;
  CopyTexSubImage2D *pCVar11;
  RenderTexture *pRVar12;
  ReadPixels *pRVar13;
  CompareData *this_03;
  DeleteTexture *pDVar14;
  DeleteShader *pDVar15;
  DeleteProgram *this_04;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *pSVar16;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> texture;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1f0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1d0;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_1c0;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_1b0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1a0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_190;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_180;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_170;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_160;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_150;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_140;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_130;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_120;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_110;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_100;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_f0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_d0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_c0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_b0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_a0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_90;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_80;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_70;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_40;
  
  vertexShader.m_ptr = (Shader *)0x0;
  vertexShader.m_state = (SharedPtrStateBase *)0x0;
  fragmentShader.m_ptr = (Shader *)0x0;
  fragmentShader.m_state = (SharedPtrStateBase *)0x0;
  program.m_ptr = (Program *)0x0;
  program.m_state = (SharedPtrStateBase *)0x0;
  if ((this->m_config).render == true) {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar4,0x8b31,&vertexShader,(this->m_config).useFenceSync,(this->m_config).serverSync
              );
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar4);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (ShaderSource *)operator_new(0x98);
    local_e0.m_ptr = vertexShader.m_ptr;
    local_e0.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar5,&local_e0,
               "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_e0);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = (ShaderCompile *)operator_new(0x78);
    local_f0.m_ptr = vertexShader.m_ptr;
    local_f0.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar6,&local_f0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_f0);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar4,0x8b30,&fragmentShader,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar4);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (ShaderSource *)operator_new(0x98);
    local_100.m_ptr = fragmentShader.m_ptr;
    local_100.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar5,&local_100,
               "varying mediump vec2 v_pos;\nuniform sampler2D u_sampler;\nvoid main(void)\n{\n\tgl_FragColor = texture2D(u_sampler, v_pos);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_100);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = (ShaderCompile *)operator_new(0x78);
    local_110.m_ptr = fragmentShader.m_ptr;
    local_110.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar6,&local_110,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_110);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (CreateProgram *)operator_new(0x78);
    GLES2ThreadTest::CreateProgram::CreateProgram
              (this_00,&program,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_00);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar7 = (AttachShader *)operator_new(0x88);
    local_120.m_ptr = program.m_ptr;
    local_120.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_130.m_ptr = fragmentShader.m_ptr;
    local_130.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar7,&local_120,&local_130,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar7);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_130);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_120);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar7 = (AttachShader *)operator_new(0x88);
    local_140.m_ptr = program.m_ptr;
    local_140.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_150.m_ptr = vertexShader.m_ptr;
    local_150.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar7,&local_140,&local_150,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar7);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_150);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_140);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_01 = (LinkProgram *)operator_new(0x78);
    local_160.m_ptr = program.m_ptr;
    local_160.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::LinkProgram::LinkProgram
              (this_01,&local_160,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_01);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_160);
  }
  texture.m_ptr = (Texture *)0x0;
  texture.m_state = (SharedPtrStateBase *)0x0;
  pEVar1 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_02 = (CreateTexture *)operator_new(0x78);
  GLES2ThreadTest::CreateTexture::CreateTexture
            (this_02,&texture,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_02);
  iVar3 = (this->m_config).define;
  if (iVar3 == 1) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pTVar8 = (TexImage2D *)operator_new(0x90);
      local_50.m_ptr = texture.m_ptr;
      local_50.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar16 = &local_50;
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar8,pSVar16,0,0x1908,0x100,0x100,0x1908,0x1401,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar8);
    }
    else {
      pEVar1 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar8 = (TexImage2D *)operator_new(0x90);
      local_40.m_ptr = texture.m_ptr;
      local_40.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar16 = &local_40;
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar8,pSVar16,0,0x1908,0x100,0x100,0x1908,0x1401,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar8);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar16);
    iVar3 = (this->m_config).define;
  }
  if (iVar3 == 2) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pCVar9 = (CopyTexImage2D *)operator_new(0x98);
      local_70.m_ptr = texture.m_ptr;
      local_70.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar16 = &local_70;
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar9,pSVar16,0,0x1908,0x11,0x11,0x100,0x100,0,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar9);
    }
    else {
      pEVar1 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar9 = (CopyTexImage2D *)operator_new(0x98);
      local_60.m_ptr = texture.m_ptr;
      local_60.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar16 = &local_60;
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar9,pSVar16,0,0x1908,0x11,0x11,0x100,0x100,0,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar9);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar16);
  }
  iVar3 = (this->m_config).modify;
  if (iVar3 == 1) {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar1 = *ppEVar2;
      pTVar10 = (TexSubImage2D *)operator_new(0x98);
      local_80.m_ptr = texture.m_ptr;
      local_80.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar16 = &local_80;
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar10,pSVar16,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar10);
    }
    else {
      pEVar1 = ppEVar2[1];
      pTVar10 = (TexSubImage2D *)operator_new(0x98);
      local_90.m_ptr = texture.m_ptr;
      local_90.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar16 = &local_90;
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar10,pSVar16,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar10);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar16);
    iVar3 = (this->m_config).modify;
  }
  if (iVar3 == 2) {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar1 = *ppEVar2;
      pCVar11 = (CopyTexSubImage2D *)operator_new(0x98);
      local_a0.m_ptr = texture.m_ptr;
      local_a0.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar16 = &local_a0;
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar11,pSVar16,0,7,7,0x11,0x11,0x1d,0x1d,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar11);
    }
    else {
      pEVar1 = ppEVar2[1];
      pCVar11 = (CopyTexSubImage2D *)operator_new(0x98);
      local_b0.m_ptr = texture.m_ptr;
      local_b0.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar16 = &local_b0;
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar11,pSVar16,0,7,7,0x11,0x11,0x1d,0x1d,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar11);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar16);
  }
  if ((this->m_config).render == true) {
    pixels1.m_ptr = (DataBlock *)0x0;
    pixels1.m_state = (SharedPtrStateBase *)0x0;
    pixels2.m_ptr = (DataBlock *)0x0;
    pixels2.m_state = (SharedPtrStateBase *)0x0;
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar12 = (RenderTexture *)operator_new(0x88);
    local_170.m_ptr = program.m_ptr;
    local_170.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_180.m_ptr = texture.m_ptr;
    local_180.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar12,&local_170,&local_180,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar12);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&local_180);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_170);
    pEVar1 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pRVar12 = (RenderTexture *)operator_new(0x88);
    local_190.m_ptr = program.m_ptr;
    local_190.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_1a0.m_ptr = texture.m_ptr;
    local_1a0.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar12,&local_190,&local_1a0,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar12);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&local_1a0);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_190);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar13 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar13,0,0,400,400,0x1908,0x1401,&pixels1,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar13);
    pEVar1 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pRVar13 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar13,0,0,400,400,0x1908,0x1401,&pixels2,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar13);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_03 = (CompareData *)operator_new(0x58);
    local_1b0.m_ptr = pixels1.m_ptr;
    local_1b0.m_state = pixels1.m_state;
    if (pixels1.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (pixels1.m_state)->strongRefCount = (pixels1.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (pixels1.m_state)->weakRefCount = (pixels1.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_1c0.m_ptr = pixels2.m_ptr;
    local_1c0.m_state = pixels2.m_state;
    if (pixels2.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (pixels2.m_state)->strongRefCount = (pixels2.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (pixels2.m_state)->weakRefCount = (pixels2.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    tcu::ThreadUtil::CompareData::CompareData(this_03,&local_1b0,&local_1c0);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_03);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&local_1c0);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&local_1b0);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&pixels2);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&pixels1);
  }
  if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
    pEVar1 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pDVar14 = (DeleteTexture *)operator_new(0x78);
    local_d0.m_ptr = texture.m_ptr;
    local_d0.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    pSVar16 = &local_d0;
    GLES2ThreadTest::DeleteTexture::DeleteTexture
              (pDVar14,pSVar16,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar14);
  }
  else {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar14 = (DeleteTexture *)operator_new(0x78);
    local_c0.m_ptr = texture.m_ptr;
    local_c0.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    pSVar16 = &local_c0;
    GLES2ThreadTest::DeleteTexture::DeleteTexture
              (pDVar14,pSVar16,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar14);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(pSVar16);
  if ((this->m_config).render == true) {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar15 = (DeleteShader *)operator_new(0x78);
    local_1d0.m_ptr = vertexShader.m_ptr;
    local_1d0.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar15,&local_1d0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar15);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_1d0);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar15 = (DeleteShader *)operator_new(0x78);
    local_1e0.m_ptr = fragmentShader.m_ptr;
    local_1e0.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar15,&local_1e0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar15);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_1e0);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_04 = (DeleteProgram *)operator_new(0x78);
    local_1f0.m_ptr = program.m_ptr;
    local_1f0.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (this_04,&local_1f0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_04);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_1f0);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&program);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&fragmentShader);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&vertexShader);
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addTextureOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;
	SharedPtr<GLES2ThreadTest::Program>	program;

	if (m_config.render)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"uniform sampler2D u_sampler;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = texture2D(u_sampler, v_pos);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Texture> texture;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateTexture(texture, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define == 1)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.define == 2)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 17, 17, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 17, 17, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 1)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 2)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.render)
	{
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;

		m_threads[0]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels1, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels2, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new tcu::ThreadUtil::CompareData(pixels1, pixels2));
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	}
}